

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  lua_State *in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  StkId o;
  undefined4 in_stack_00000010;
  TValue *local_28;
  
  local_28 = index2adr(in_RDI,in_ESI);
  if (local_28->tt != 4) {
    iVar1 = luaV_tostring(L,(StkId)CONCAT44(idx,in_stack_00000010));
    if (iVar1 == 0) {
      if (in_RDX != (lua_State *)0x0) {
        in_RDX->next = (GCObject *)0x0;
      }
      return (char *)0x0;
    }
    if (in_RDI->l_G->GCthreshold <= in_RDI->l_G->totalbytes) {
      luaC_step(in_RDX);
    }
    local_28 = index2adr(in_RDI,in_ESI);
  }
  if (in_RDX != (lua_State *)0x0) {
    in_RDX->next = (GCObject *)(((local_28->value).gc)->h).metatable;
  }
  return (char *)&(((local_28->value).gc)->h).array;
}

Assistant:

static const char*lua_tolstring(lua_State*L,int idx,size_t*len){
StkId o=index2adr(L,idx);
if(!ttisstring(o)){
if(!luaV_tostring(L,o)){
if(len!=NULL)*len=0;
return NULL;
}
luaC_checkGC(L);
o=index2adr(L,idx);
}
if(len!=NULL)*len=tsvalue(o)->len;
return svalue(o);
}